

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointPoint::IntFromDescriptor
          (ChLinkPointPoint *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  undefined4 in_register_00000034;
  
  iVar3 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar3 == '\0') {
    return;
  }
  lVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < lVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[off_L] = (this->constraint1).super_ChConstraintTwo.super_ChConstraint.l_i;
    if ((long)(ulong)(off_L + 1) < lVar1) {
      pdVar2[off_L + 1] = (this->constraint2).super_ChConstraintTwo.super_ChConstraint.l_i;
      if ((long)(ulong)(off_L + 2) < lVar1) {
        pdVar2[off_L + 2] = (this->constraint3).super_ChConstraintTwo.super_ChConstraint.l_i;
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkPointPoint::IntFromDescriptor(const unsigned int off_v,
                                         ChStateDelta& v,
                                         const unsigned int off_L,
                                         ChVectorDynamic<>& L) {
    if (!IsActive())
        return;

    L(off_L + 0) = constraint1.Get_l_i();
    L(off_L + 1) = constraint2.Get_l_i();
    L(off_L + 2) = constraint3.Get_l_i();
}